

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,ComputeInvocationsTestInstance *this,
          VkCommandPool *cmdPool,VkPipelineLayout pipelineLayout,VkDescriptorSet *descriptorSet,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes)

{
  deInt32 *pdVar1;
  pointer pPVar2;
  Allocation *pAVar3;
  bool bVar4;
  SharedPtrStateBase *pSVar5;
  VkCommandBuffer commandBuffer;
  VkResult VVar6;
  DeviceInterface *vk;
  VkDevice device;
  const_iterator cVar7;
  uint uVar8;
  ulong uVar9;
  Move<vk::Handle<(vk::HandleType)11>_> local_368;
  TestStatus *local_348;
  SharedPtr<vkt::Draw::Buffer> local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  string *local_328;
  SharedPtr<vkt::Draw::Buffer> *local_320;
  deUint64 local_318;
  deUint64 data;
  VkQueryPool local_308;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_300;
  VkCommandBuffer local_2e0;
  VkQueue local_2d8;
  VkDescriptorSet *local_2d0;
  VkCommandPool *local_2c8;
  ulong local_2c0;
  VkCommandBuffer local_2b8;
  long *plStack_2b0;
  qpTestLog *local_2a8;
  VkAllocationCallbacks *pVStack_2a0;
  VkPipeline local_298;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_290;
  VkShaderModule local_278;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_270;
  VkComputePipelineCreateInfo local_250;
  undefined4 local_1f0 [2];
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  deUint64 local_1d0;
  undefined8 local_1c8;
  VkDeviceSize local_1c0;
  undefined1 local_1b8 [8];
  VkDeviceMemory VStack_1b0;
  TestLog local_1a8;
  VkAllocationCallbacks *pVStack_1a0;
  ios_base local_140 [272];
  
  local_348 = __return_storage_ptr__;
  local_318 = pipelineLayout.m_internal;
  local_2d0 = descriptorSet;
  local_2c8 = cmdPool;
  vk = Context::getDeviceInterface
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)
  ;
  local_2d8 = Context::getUniversalQueue
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  local_1f0[0] = 0x2c;
  local_1e8 = 0;
  local_1e0 = 0x200000000040;
  uStack_1d8 = 0xffffffffffffffff;
  local_1d0 = (buffer->m_ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
              m_internal;
  local_1c8 = 0;
  local_1c0 = bufferSizeBytes;
  local_320 = buffer;
  if ((this->m_parameters->
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_parameters->
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_328 = (string *)&local_348->m_description;
    local_330 = &(local_348->m_description).field_2;
    local_2e0 = (VkCommandBuffer)&PTR__Allocation_00d50278;
    uVar9 = 0;
    do {
      local_340.m_ptr = local_320->m_ptr;
      local_340.m_state = local_320->m_state;
      if (local_340.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_340.m_state)->strongRefCount = (local_340.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_340.m_state)->weakRefCount = (local_340.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      clearBuffer(vk,device,&local_340,bufferSizeBytes);
      pSVar5 = local_340.m_state;
      if (local_340.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_340.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_340.m_ptr = (Buffer *)0x0;
          (*(local_340.m_state)->_vptr_SharedPtrStateBase[2])(local_340.m_state);
        }
        LOCK();
        pdVar1 = &pSVar5->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_340.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_340.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_340.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      local_2c0 = uVar9;
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                      *)((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)->
                        m_progCollection,
                     &(this->m_parameters->
                      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar9].shaderName);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)local_1b8,vk,device,
                 *(ProgramBinary **)(cVar7._M_node + 2),0);
      DStack_270.m_device = (VkDevice)local_1a8.m_log;
      DStack_270.m_allocator = pVStack_1a0;
      local_278.m_internal = (deUint64)local_1b8;
      DStack_270.m_deviceIface = (DeviceInterface *)VStack_1b0.m_internal;
      local_250.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
      local_250.pNext = (void *)0x0;
      local_250.flags = 0;
      local_250.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
      local_250.stage.pNext = (void *)0x0;
      local_250.stage.flags = 0;
      local_250.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
      local_250.stage.module.m_internal = (deUint64)local_1b8;
      local_250.stage.pName = "main";
      local_250.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
      local_250.layout.m_internal = local_318;
      local_250.basePipelineHandle.m_internal = 0;
      local_250.basePipelineIndex = 0;
      ::vk::createComputePipeline
                ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1b8,vk,device,(VkPipelineCache)0x0,
                 &local_250,(VkAllocationCallbacks *)0x0);
      DStack_290.m_device = (VkDevice)local_1a8.m_log;
      DStack_290.m_allocator = pVStack_1a0;
      local_298.m_internal = (deUint64)local_1b8;
      DStack_290.m_deviceIface = (DeviceInterface *)VStack_1b0.m_internal;
      ::vk::allocateCommandBuffer
                ((Move<vk::VkCommandBuffer_s_*> *)local_1b8,vk,device,
                 (VkCommandPool)local_2c8->m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      local_2a8 = local_1a8.m_log;
      pVStack_2a0 = pVStack_1a0;
      local_2b8 = (VkCommandBuffer)local_1b8;
      plStack_2b0 = (long *)VStack_1b0.m_internal;
      local_1b8._0_4_ = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
      VStack_1b0.m_internal = 0;
      local_1a8.m_log = (qpTestLog *)0x100000000;
      pVStack_1a0 = (VkAllocationCallbacks *)0x40000000001;
      ::vk::createQueryPool
                (&local_368,vk,device,(VkQueryPoolCreateInfo *)local_1b8,
                 (VkAllocationCallbacks *)0x0);
      commandBuffer = local_2b8;
      local_308.m_internal =
           local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
      DStack_300.m_deviceIface =
           local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
      DStack_300.m_device._0_4_ =
           local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device._0_4_;
      DStack_300.m_device._4_4_ =
           local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device._4_4_;
      DStack_300.m_allocator._0_4_ =
           local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator._0_4_
      ;
      DStack_300.m_allocator._4_4_ =
           local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator._4_4_
      ;
      local_1a8.m_log = (qpTestLog *)&DAT_00000001;
      pVStack_1a0 = (VkAllocationCallbacks *)0x0;
      local_1b8 = (undefined1  [8])0x2a;
      VStack_1b0.m_internal = 0;
      VVar6 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_2b8,(VkQueryPoolCreateInfo *)local_1b8);
      ::vk::checkResult(VVar6,"vk.beginCommandBuffer(commandBuffer, &info)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                        ,0x75);
      (*vk->_vptr_DeviceInterface[0x70])(vk,commandBuffer,local_308.m_internal,0,1);
      (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_298.m_internal);
      (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,1,local_318,0,1,local_2d0,0,0);
      (*vk->_vptr_DeviceInterface[0x6e])(vk,commandBuffer,local_308.m_internal,0,0);
      pPVar2 = (this->m_parameters->
               super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (*vk->_vptr_DeviceInterface[0x5d])
                (vk,commandBuffer,(ulong)pPVar2[uVar9].groupSize.m_data[0],
                 (ulong)pPVar2[uVar9].groupSize.m_data[1],(ulong)pPVar2[uVar9].groupSize.m_data[2]);
      (*vk->_vptr_DeviceInterface[0x6f])(vk,commandBuffer,local_308.m_internal,0);
      (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x800,0x4000,0,0,0,1,local_1f0,0,0);
      VVar6 = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
      ::vk::checkResult(VVar6,"vk.endCommandBuffer(*cmdBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                        ,0x17f);
      local_1b8 = (undefined1  [8])
                  ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)->m_testCtx
                  ->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&VStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&VStack_1b0,"Compute shader invocations: ",0x1c);
      std::ostream::_M_insert<unsigned_long>((ulong)&VStack_1b0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&VStack_1b0);
      std::ios_base::~ios_base(local_140);
      submitCommandsAndWait(vk,device,local_2d8,commandBuffer);
      pAVar3 = (local_320->m_ptr->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      local_1b8 = (undefined1  [8])local_2e0;
      pVStack_1a0 = (VkAllocationCallbacks *)pAVar3->m_hostPtr;
      VStack_1b0.m_internal = (pAVar3->m_memory).m_internal;
      local_1a8.m_log = (qpTestLog *)pAVar3->m_offset;
      ::vk::invalidateMappedMemoryRange
                (vk,device,VStack_1b0,(VkDeviceSize)local_1a8.m_log,bufferSizeBytes);
      data = 0;
      VVar6 = (*vk->_vptr_DeviceInterface[0x20])(vk,device,local_308.m_internal,0,1,8,&data,0,1);
      ::vk::checkResult(VVar6,
                        "vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                        ,0x18c);
      pPVar2 = (this->m_parameters->
               super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (data == pPVar2[uVar9].localSize.m_data[1] * pPVar2[uVar9].localSize.m_data[0] *
                  pPVar2[uVar9].localSize.m_data[2] * pPVar2[uVar9].groupSize.m_data[0] *
                  pPVar2[uVar9].groupSize.m_data[1] * pPVar2[uVar9].groupSize.m_data[2]) {
        pPVar2 = (this->m_parameters->
                 super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = pPVar2[uVar9].localSize.m_data[1] * pPVar2[uVar9].localSize.m_data[0] *
                pPVar2[uVar9].localSize.m_data[2] * pPVar2[uVar9].groupSize.m_data[0] *
                pPVar2[uVar9].groupSize.m_data[1] * pPVar2[uVar9].groupSize.m_data[2];
        bVar4 = true;
        if (uVar8 != 0) {
          uVar9 = 0;
          do {
            if (uVar9 != *(uint *)((long)&pVStack_1a0->pUserData + uVar9 * 4)) {
              local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal =
                   (deUint64)
                   &local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_368,"Compute shader didn\'t write data to the buffer","");
              local_348->m_code = QP_TEST_RESULT_FAIL;
              (local_348->m_description)._M_dataplus._M_p = (pointer)local_330;
              std::__cxx11::string::_M_construct<char*>
                        (local_328,
                         local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
                         m_internal,
                         (long)&(local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.
                                 deleter.m_deviceIface)->_vptr_DeviceInterface +
                         local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
                         m_internal);
              goto LAB_006d28ac;
            }
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
      }
      else {
        local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal =
             (deUint64)
             &local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_368,"QueryPoolResults incorrect","");
        local_348->m_code = QP_TEST_RESULT_FAIL;
        (local_348->m_description)._M_dataplus._M_p = (pointer)local_330;
        std::__cxx11::string::_M_construct<char*>
                  (local_328,
                   local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal
                   ,(long)&(local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                    local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
                    m_internal);
LAB_006d28ac:
        if ((VkDevice *)
            local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal !=
            &local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device) {
          operator_delete((void *)local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.
                                  object.m_internal,
                          CONCAT44(local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.
                                   deleter.m_device._4_4_,
                                   local_368.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.
                                   deleter.m_device._0_4_) + 1);
        }
        bVar4 = false;
      }
      ::vk::Allocation::~Allocation((Allocation *)local_1b8);
      if (local_308.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
                  (&DStack_300,local_308);
      }
      if (commandBuffer != (VkCommandBuffer)0x0) {
        local_1b8 = (undefined1  [8])commandBuffer;
        (**(code **)(*plStack_2b0 + 0x240))(plStack_2b0,local_2a8,pVStack_2a0,1);
      }
      if (local_298.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&DStack_290,local_298);
      }
      if (local_278.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&DStack_270,local_278);
      }
      if (!bVar4) {
        return local_348;
      }
      uVar9 = local_2c0 + 1;
    } while (uVar9 < (ulong)(((long)(this->m_parameters->
                                    super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_parameters->
                                    super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
  local_348->m_code = QP_TEST_RESULT_PASS;
  (local_348->m_description)._M_dataplus._M_p = (pointer)&(local_348->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348->m_description,local_1b8,
             (long)(qpTestLog **)local_1b8 + VStack_1b0.m_internal);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8.m_log)->flags + 1));
  }
  return local_348;
}

Assistant:

tcu::TestStatus ComputeInvocationsTestInstance::executeTest (const VkCommandPool&			cmdPool,
															 const VkPipelineLayout			pipelineLayout,
															 const VkDescriptorSet&			descriptorSet,
															 const de::SharedPtr<Buffer>	buffer,
															 const VkDeviceSize				bufferSizeBytes)
{
	const DeviceInterface&				vk						= m_context.getDeviceInterface();
	const VkDevice						device					= m_context.getDevice();
	const VkQueue						queue					= m_context.getUniversalQueue();
	const VkBufferMemoryBarrier			computeFinishBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	for(size_t parametersNdx = 0u; parametersNdx < m_parameters.size(); ++parametersNdx)
	{
		clearBuffer(vk, device, buffer, bufferSizeBytes);
		const Unique<VkShaderModule>			shaderModule				(createShaderModule(vk, device,
																			m_context.getBinaryCollection().get(m_parameters[parametersNdx].shaderName), (VkShaderModuleCreateFlags)0u));

		const VkPipelineShaderStageCreateInfo	pipelineShaderStageParams	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0u,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
			*shaderModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		};

		const VkComputePipelineCreateInfo		pipelineCreateInfo			=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,										// const void*						pNext;
			(VkPipelineCreateFlags)0u,						// VkPipelineCreateFlags			flags;
			pipelineShaderStageParams,						// VkPipelineShaderStageCreateInfo	stage;
			pipelineLayout,									// VkPipelineLayout					layout;
			DE_NULL,										// VkPipeline						basePipelineHandle;
			0,												// deInt32							basePipelineIndex;
		};
		const Unique<VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo));

		const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const Unique<VkQueryPool>		queryPool			(makeQueryPool(vk, device, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT));

		beginCommandBuffer(vk, *cmdBuffer);
			vk.cmdResetQueryPool(*cmdBuffer, *queryPool, 0u, 1u);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

			vk.cmdBeginQuery(*cmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
			vk.cmdDispatch(*cmdBuffer, m_parameters[parametersNdx].groupSize.x(), m_parameters[parametersNdx].groupSize.y(), m_parameters[parametersNdx].groupSize.z());
			vk.cmdEndQuery(*cmdBuffer, *queryPool, 0u);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT,
				(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeFinishBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);
		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Compute shader invocations: " << getComputeExecution(m_parameters[parametersNdx]) << tcu::TestLog::EndMessage;

		// Wait for completion
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Validate the results
		const Allocation& bufferAllocation = buffer->getBoundMemory();
		invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);

		{
			deUint64 data = 0u;
			VK_CHECK(vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT));
			if (getComputeExecution(m_parameters[parametersNdx]) != data)
				return tcu::TestStatus::fail("QueryPoolResults incorrect");
		}

		const deUint32* bufferPtr = static_cast<deUint32*>(bufferAllocation.getHostPtr());
		for (deUint32 ndx = 0u; ndx < getComputeExecution(m_parameters[parametersNdx]); ++ndx)
		{
			if (bufferPtr[ndx] != ndx)
				return tcu::TestStatus::fail("Compute shader didn't write data to the buffer");
		}
	}
	return tcu::TestStatus::pass("Pass");
}